

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O0

void __thiscall Refal2::CScanner::processingWord(CScanner *this,char c)

{
  bool bVar1;
  char c_local;
  CScanner *this_local;
  
  bVar1 = IsWordLetter(c);
  if (bVar1) {
    std::__cxx11::string::operator+=
              ((string *)
               &(this->super_CParser).super_CDirectiveParser.super_CRuleParser.
                super_CQualifierParser.token.word,c);
  }
  else {
    addToken(this,TT_Word);
    this->state = S_Initial;
    processing(this,c);
  }
  return;
}

Assistant:

void CScanner::processingWord( char c )
{
	if( IsWordLetter( c ) ) {
		token.word += c;
	} else {
		addToken( TT_Word );
		state = S_Initial;
		processing( c );
	}
}